

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O0

CalibrationParams __thiscall
deqp::gles2::Functional::anon_unknown_0::FlushFinishCase::calibrate(FlushFinishCase *this)

{
  int iVar1;
  deInt32 x;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  deUint64 dVar4;
  CalibrationFailedException *this_00;
  float local_544;
  float local_53c;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  LogNumber<long> local_428;
  float local_3b4;
  float local_3b0;
  float est;
  float b;
  float a;
  deUint64 local_228;
  deUint64 startTime;
  deUint64 curDuration;
  MessageBuilder local_210;
  int local_90;
  int local_8c;
  int curDrawCount;
  int prevDrawCount;
  deUint64 prevDuration;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ScopedLogSection local_20;
  ScopedLogSection section;
  FlushFinishCase *this_local;
  CalibrationParams params;
  
  section.m_log = (TestLog *)this;
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CalibrationInfo",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Calibration info",(allocator<char> *)((long)&prevDuration + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_20,pTVar2,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&prevDuration + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  _curDrawCount = 0;
  local_8c = 1;
  local_90 = 1;
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_210,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_210,
                      (char (*) [56])"Calibrating maximum draw call count, target duration = ");
  curDuration._4_4_ = 1000000;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&curDuration + 4));
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])" us");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_210);
  while( true ) {
    local_228 = deGetMicroseconds();
    render(this,local_90);
    readPixels(this);
    dVar4 = deGetMicroseconds();
    startTime = dVar4 - local_228;
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&b,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<((MessageBuilder *)&b,(char (*) [15])"Duration with ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_90);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])" draw calls = ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&startTime);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])" us");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&b);
    if (1000000 < startTime) break;
    if (0xfffff < local_90) goto LAB_01a42a79;
    local_8c = local_90;
    _curDrawCount = startTime;
    local_90 = local_90 << 1;
  }
  if (1 < local_90) {
    local_53c = (float)(startTime - _curDrawCount);
    est = local_53c / (float)(local_90 - local_8c);
    local_544 = (float)_curDrawCount;
    local_3b0 = local_544 - est * (float)local_8c;
    local_3b4 = (1e+06 - local_3b0) / est;
    x = ::deFloorFloatToInt32(local_3b4);
    local_90 = de::clamp<int>(x,1,0x100000);
  }
LAB_01a42a79:
  iVar1 = local_90;
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"MaxDrawCalls",&local_449)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"Maximum number of draw calls",&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"",&local_499);
  tcu::LogNumber<long>::LogNumber
            (&local_428,&local_448,&local_470,&local_498,QP_KEY_TAG_NONE,(long)iVar1);
  tcu::TestLog::operator<<(pTVar2,&local_428);
  tcu::LogNumber<long>::~LogNumber(&local_428);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  if (iVar1 < 10) {
    this_00 = (CalibrationFailedException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"Calibration failed, maximum draw call count is too low",
               &local_4c1);
    CalibrationFailedException::CalibrationFailedException(this_00,&local_4c0);
    __cxa_throw(this_00,&Functional::(anonymous_namespace)::CalibrationFailedException::typeinfo,
                CalibrationFailedException::~CalibrationFailedException);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_20);
  return (CalibrationParams)iVar1;
}

Assistant:

FlushFinishCase::CalibrationParams FlushFinishCase::calibrate (void)
{
	tcu::ScopedLogSection		section				(m_testCtx.getLog(), "CalibrationInfo", "Calibration info");
	CalibrationParams			params;

	// Find draw call count that results in desired maximum time.
	{
		deUint64			prevDuration			= 0;
		int					prevDrawCount			= 1;
		int					curDrawCount			= 1;

		m_testCtx.getLog() << TestLog::Message << "Calibrating maximum draw call count, target duration = " << int(MAX_SAMPLE_DURATION_US) << " us" << TestLog::EndMessage;

		for (;;)
		{
			deUint64 curDuration;

			{
				const deUint64	startTime	= deGetMicroseconds();
				render(curDrawCount);
				readPixels();
				curDuration = deGetMicroseconds()-startTime;
			}

			m_testCtx.getLog() << TestLog::Message << "Duration with " << curDrawCount << " draw calls = " << curDuration << " us" << TestLog::EndMessage;

			if (curDuration > MAX_SAMPLE_DURATION_US)
			{
				if (curDrawCount > 1)
				{
					// Compute final count by using linear estimation.
					const float		a		= float(curDuration - prevDuration) / float(curDrawCount - prevDrawCount);
					const float		b		= float(prevDuration) - a*float(prevDrawCount);
					const float		est		= (float(MAX_SAMPLE_DURATION_US) - b) / a;

					curDrawCount = de::clamp(deFloorFloatToInt32(est), 1, int(MAX_DRAW_CALL_COUNT));
				}
				// else: Settle on 1.

				break;
			}
			else if (curDrawCount >= MAX_DRAW_CALL_COUNT)
				break; // Settle on maximum.
			else
			{
				prevDrawCount	= curDrawCount;
				prevDuration	= curDuration;
				curDrawCount	= curDrawCount*2;
			}
		}

		params.maxDrawCalls = curDrawCount;

		m_testCtx.getLog() << TestLog::Integer("MaxDrawCalls", "Maximum number of draw calls", "", QP_KEY_TAG_NONE, params.maxDrawCalls);
	}

	// Sanity check.
	if (params.maxDrawCalls < MIN_DRAW_CALL_COUNT)
		throw CalibrationFailedException("Calibration failed, maximum draw call count is too low");

	return params;
}